

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token openParen_00;
  Token semi1_00;
  Token semi2_00;
  Token closeParen_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_00;
  Token forKeyword_00;
  Info *stopExpr_00;
  bool bVar1;
  int iVar2;
  StatementSyntax *syntax;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForLoopStatementSyntax *pFVar3;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  EVP_PKEY_CTX *src_00;
  size_type extraout_RDX_00;
  Token TVar4;
  Token TVar5;
  Token TVar6;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_2e8;
  Token local_2b8;
  char local_2a8 [8];
  Info *pIStack_2a0;
  pointer local_298;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> local_288;
  Info *local_258;
  Info *pIStack_250;
  Info *local_248;
  Info *pIStack_240;
  pointer local_238;
  size_type sStack_230;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  char local_1e8 [8];
  Info *pIStack_1e0;
  StatementSyntax *local_1d0;
  StatementSyntax *body;
  undefined4 local_1bc;
  undefined1 local_1b8 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  Token closeParen;
  undefined1 auStack_110 [8];
  Token semi2;
  ExpressionSyntax *stopExpr;
  undefined4 local_ec;
  anon_class_8_1_8991fb9c local_e8;
  undefined4 local_e0;
  undefined1 local_d0 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  Token semi1;
  Token openParen;
  Token forKeyword;
  NamedLabelSyntax *label_local;
  Parser *this_local;
  AttrList attributes_local;
  
  TVar4 = ParserBase::consume(&this->super_ParserBase);
  TVar5 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  Token::Token((Token *)(initializers.stackBase + 0x40));
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_d0);
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
    local_e0 = 0x2c0005;
    local_e8.this = this;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseForLoopStatement(slang::syntax::NamedLabelSyntax*,nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__0>
              (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_d0,
               Semicolon,Comma,(Token *)(initializers.stackBase + 0x40),False,(DiagCode)0x2c0005,
               &local_e8,False);
  }
  else {
    local_ec = 0x2c0005;
    stopExpr = (ExpressionSyntax *)this;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseForLoopStatement(slang::syntax::NamedLabelSyntax*,nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__1>
              (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_d0,
               Semicolon,Comma,(Token *)(initializers.stackBase + 0x40),False,(DiagCode)0x2c0005,
               (anon_class_8_1_8991fb9c *)&stopExpr,False);
  }
  semi2.info = (Info *)0x0;
  Token::Token((Token *)auStack_110);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar1) {
    TVar6 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    semi2.info = (Info *)parseExpression(this);
    TVar6 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  semi2._0_8_ = TVar6.info;
  auStack_110 = TVar6._0_8_;
  Token::Token((Token *)(steps.stackBase + 0x40));
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_1b8);
  local_1bc = 0x10001;
  body = (StatementSyntax *)this;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseForLoopStatement(slang::syntax::NamedLabelSyntax*,nonstd::span_lite::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>)::__2>
            (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b8,
             CloseParenthesis,Comma,(Token *)(steps.stackBase + 0x40),False,(DiagCode)0x10001,
             (anon_class_8_1_8991fb9c *)&body,False);
  syntax = parseStatement(this,true,false);
  local_1e8[0] = steps.stackBase[0x40];
  local_1e8[1] = steps.stackBase[0x41];
  local_1e8[2] = steps.stackBase[0x42];
  local_1e8[3] = steps.stackBase[0x43];
  local_1e8[4] = steps.stackBase[0x44];
  local_1e8[5] = steps.stackBase[0x45];
  local_1e8[6] = steps.stackBase[0x46];
  local_1e8[7] = steps.stackBase[0x47];
  pIStack_1e0 = (Info *)closeParen._0_8_;
  local_1d0 = syntax;
  local_1f8 = sv("for loop",8);
  TVar6.info = pIStack_1e0;
  TVar6._0_8_ = local_1e8;
  checkEmptyBody(this,&syntax->super_SyntaxNode,TVar6,local_1f8);
  local_238 = attributes.data_;
  sStack_230 = attributes.size_;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_228,attributes);
  openParen.info = TVar4._0_8_;
  forKeyword._0_8_ = TVar4.info;
  local_248 = openParen.info;
  pIStack_240 = (Info *)forKeyword._0_8_;
  semi1.info = TVar5._0_8_;
  openParen._0_8_ = TVar5.info;
  local_258 = semi1.info;
  pIStack_250 = (Info *)openParen._0_8_;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_d0,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_298 = (pointer)CONCAT44(extraout_var,iVar2);
  elements_00.size_ = extraout_RDX;
  elements_00.data_ = local_298;
  slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::SeparatedSyntaxList
            (&local_288,elements_00);
  stopExpr_00 = semi2.info;
  local_2a8[0] = initializers.stackBase[0x40];
  local_2a8[1] = initializers.stackBase[0x41];
  local_2a8[2] = initializers.stackBase[0x42];
  local_2a8[3] = initializers.stackBase[0x43];
  local_2a8[4] = initializers.stackBase[0x44];
  local_2a8[5] = initializers.stackBase[0x45];
  local_2a8[6] = initializers.stackBase[0x46];
  local_2a8[7] = initializers.stackBase[0x47];
  pIStack_2a0 = (Info *)semi1._0_8_;
  local_2b8.kind = auStack_110._0_2_;
  local_2b8._2_1_ = auStack_110[2];
  local_2b8.numFlags.raw = auStack_110[3];
  local_2b8.rawLen = auStack_110._4_4_;
  local_2b8.info = (Info *)semi2._0_8_;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  elements.data_._4_4_ = extraout_var_00;
  elements.data_._0_4_ = iVar2;
  elements.size_ = extraout_RDX_00;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&local_2e8,elements);
  forKeyword_00.info = pIStack_240;
  forKeyword_00._0_8_ = local_248;
  openParen_00.info = pIStack_250;
  openParen_00._0_8_ = local_258;
  semi1_00.info = pIStack_2a0;
  semi1_00._0_8_ = local_2a8;
  semi2_00.info = local_2b8.info;
  semi2_00.kind = local_2b8.kind;
  semi2_00._2_1_ = local_2b8._2_1_;
  semi2_00.numFlags.raw = local_2b8.numFlags.raw;
  semi2_00.rawLen = local_2b8.rawLen;
  closeParen_00.info = (Info *)closeParen._0_8_;
  closeParen_00._0_8_ = steps.stackBase._64_8_;
  pFVar3 = slang::syntax::SyntaxFactory::forLoopStatement
                     (&this->factory,label,&local_228,forKeyword_00,openParen_00,&local_288,semi1_00
                      ,(ExpressionSyntax *)stopExpr_00,semi2_00,&local_2e8,closeParen_00,local_1d0);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_1b8);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)local_d0);
  return pFVar3;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}